

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

uint64_t SS_GenHashSeed(int index)

{
  int iVar1;
  uint64_t uVar2;
  int in_EDI;
  uint64_t y;
  uint64_t x;
  long local_18;
  uchar local_10 [12];
  int local_4;
  
  local_4 = in_EDI;
  if (SS_seed == 0) {
    iVar1 = rand();
    SS_seed = (uint64_t)iVar1;
  }
  local_18 = SS_seed + (long)local_4;
  SS_mangle((uchar *)&local_18,local_10,8);
  uVar2 = SS_AwareHash((uchar *)&local_18,8,0x172a550d,0x172a554f,0x46253dc2);
  return uVar2;
}

Assistant:

uint64_t SS_GenHashSeed(int index) {
	/*
	if (index == 0) {
		srand(0);
	}
	*/
	if (SS_seed == 0) {
		SS_seed = rand();
	}
	uint64_t x, y = SS_seed + index;
	SS_mangle((const unsigned char*)&y, (unsigned char*)&x, 8);
	return SS_AwareHash((uint8_t*)&y, 8, 388650253, 388650319, 1176845762);
}